

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.c
# Opt level: O3

void qcc_engine_run_test(qcc_engine *eng,char *name,qcc_test_fn test_fn)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  qcc_stream_data_process_fn proc;
  qcc_stream_data data;
  qcc_test_result qVar5;
  uint uVar6;
  qcc_stream *pqVar7;
  qcc_arena *arena;
  qcc_stream *pqVar8;
  uint uVar9;
  size_t num;
  long lVar10;
  qcc_stream_interval *pqVar11;
  byte bVar12;
  undefined1 auVar13 [16];
  qcc_stream_data shrinked_data;
  qcc_logger logger;
  qcc_stream stream;
  qcc_stream tmp_stream;
  qcc_stream_data local_108;
  qcc_logger local_f8;
  qcc_logger local_d8;
  qcc_stream local_c0;
  qcc_stream local_78;
  
  bVar12 = 0;
  if (eng->max_tries != 0) {
    uVar9 = 0;
    uVar6 = 0;
    do {
      qcc_arena_reset(eng->active_arena);
      qcc_stream_init(&local_c0,(qcc_stream_data *)0x0,eng->active_arena);
      qcc_logger_init(&local_f8,eng->active_arena);
      qVar5 = _run_test_once((qcc_engine *)eng->active_arena,name,test_fn,&local_c0,&local_f8);
      if (qVar5 == QCC_TEST_FAIL) {
        uVar2 = eng->total_tests;
        uVar4 = eng->failed_tests;
        eng->total_tests = uVar2 + 1;
        eng->failed_tests = uVar4 + 1;
        arena = eng->backup_arena;
        eng->backup_arena = eng->active_arena;
        eng->active_arena = arena;
        goto LAB_00102cfb;
      }
      uVar6 = uVar6 + (qVar5 == QCC_TEST_SUCCEED);
    } while ((uVar6 != eng->required_successes) && (uVar9 = uVar9 + 1, uVar9 != eng->max_tries));
    if (uVar6 != 0) {
      eng->total_tests = eng->total_tests + 1;
      if (eng->required_successes <= uVar6) {
        return;
      }
      qcc_logger_printf(&eng->logger,"%s:\n",name);
      qcc_logger_printf(&eng->logger,"    Warning: Only %u successful runs out of %u were made\n",
                        (ulong)uVar6,(ulong)eng->required_successes);
      return;
    }
  }
  uVar1 = eng->total_tests;
  uVar3 = eng->failed_tests;
  eng->total_tests = uVar1 + 1;
  eng->failed_tests = uVar3 + 1;
  qcc_logger_printf(&eng->logger,"%s: ABORTED\n",name);
  qcc_logger_printf(&eng->logger,"    No input was accepted by test as valid\n");
  return;
LAB_00102cfb:
  qcc_arena_reset(arena);
  lVar10 = 0;
  while (local_c0.interval_data.first == (qcc_stream_interval *)0x0) {
LAB_00102da5:
    lVar10 = lVar10 + 1;
    if (lVar10 == 4) {
      qcc_logger_append(&eng->logger,"%s",&local_f8);
      return;
    }
  }
  proc = (qcc_stream_data_process_fn)(&_run_test_and_shrink_try_shrink)[lVar10];
  pqVar11 = local_c0.interval_data.first;
LAB_00102d1c:
  data.first._1_1_ = local_c0.data.first._1_1_;
  data.first._0_1_ = (char)local_c0.data.first;
  data.first._2_1_ = local_c0.data.first._2_1_;
  data.first._3_1_ = local_c0.data.first._3_1_;
  data.first._4_1_ = local_c0.data.first._4_1_;
  data.first._5_1_ = local_c0.data.first._5_1_;
  data.first._6_1_ = local_c0.data.first._6_1_;
  data.first._7_1_ = local_c0.data.first._7_1_;
  data.last._0_1_ = (char)local_c0.data.last;
  data.last._1_1_ = local_c0.data.last._1_1_;
  data.last._2_1_ = local_c0.data.last._2_1_;
  data.last._3_1_ = local_c0.data.last._3_1_;
  data.last._4_1_ = local_c0.data.last._4_1_;
  data.last._5_1_ = local_c0.data.last._5_1_;
  data.last._6_1_ = local_c0.data.last._6_1_;
  data.last._7_1_ = local_c0.data.last._7_1_;
  local_108 = qcc_stream_data_process(data,eng->active_arena,pqVar11->begin,pqVar11->end,proc);
  auVar13[0] = -((char)local_108.first == (char)local_c0.data.first);
  auVar13[1] = -(local_108.first._1_1_ == local_c0.data.first._1_1_);
  auVar13[2] = -(local_108.first._2_1_ == local_c0.data.first._2_1_);
  auVar13[3] = -(local_108.first._3_1_ == local_c0.data.first._3_1_);
  auVar13[4] = -(local_108.first._4_1_ == local_c0.data.first._4_1_);
  auVar13[5] = -(local_108.first._5_1_ == local_c0.data.first._5_1_);
  auVar13[6] = -(local_108.first._6_1_ == local_c0.data.first._6_1_);
  auVar13[7] = -(local_108.first._7_1_ == local_c0.data.first._7_1_);
  auVar13[8] = -((char)local_108.last == (char)local_c0.data.last);
  auVar13[9] = -(local_108.last._1_1_ == local_c0.data.last._1_1_);
  auVar13[10] = -(local_108.last._2_1_ == local_c0.data.last._2_1_);
  auVar13[0xb] = -(local_108.last._3_1_ == local_c0.data.last._3_1_);
  auVar13[0xc] = -(local_108.last._4_1_ == local_c0.data.last._4_1_);
  auVar13[0xd] = -(local_108.last._5_1_ == local_c0.data.last._5_1_);
  auVar13[0xe] = -(local_108.last._6_1_ == local_c0.data.last._6_1_);
  auVar13[0xf] = -(local_108.last._7_1_ == local_c0.data.last._7_1_);
  if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(auVar13[0xf] >> 7) << 0xf)
      == 0xffff) {
LAB_00102d99:
    pqVar11 = pqVar11->next;
    if (pqVar11 == (qcc_stream_interval *)0x0) goto LAB_00102da5;
    goto LAB_00102d1c;
  }
  qcc_stream_init(&local_78,&local_108,eng->active_arena);
  qcc_logger_init(&local_d8,eng->active_arena);
  qVar5 = _run_test_once((qcc_engine *)eng->active_arena,name,test_fn,&local_78,&local_d8);
  if (qVar5 != QCC_TEST_FAIL) goto LAB_00102d99;
  pqVar7 = &local_78;
  pqVar8 = &local_c0;
  for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
    pqVar8->arena = pqVar7->arena;
    pqVar7 = (qcc_stream *)((long)pqVar7 + (ulong)bVar12 * -0x10 + 8);
    pqVar8 = (qcc_stream *)((long)pqVar8 + ((ulong)bVar12 * -2 + 1) * 8);
  }
  arena = eng->backup_arena;
  eng->backup_arena = eng->active_arena;
  eng->active_arena = arena;
  goto LAB_00102cfb;
}

Assistant:

void qcc_engine_run_test(struct qcc_engine *eng, const char *name,
                         qcc_test_fn test_fn)
{
    unsigned successes = 0;
    for (unsigned i = 0; i != eng->max_tries; ++i)
    {
        switch (_run_test_and_shrink(eng, name, test_fn))
        {
        case QCC_TEST_SUCCEED:
            ++successes;
            break;
        case QCC_TEST_FAIL:
            return;
        case QCC_TEST_SKIP:
        case QCC_TEST_OVERRUN:
            break;
        }

        if (successes == eng->required_successes) break;
    }

    if (successes == 0)
    {
        qcc_engine_failure(eng);
        qcc_logger_printf(&eng->logger, "%s: ABORTED\n", name);
        qcc_logger_printf(&eng->logger,
                          "    No input was accepted by test as valid\n");
        return;
    }

    ++eng->total_tests;
    if (successes < eng->required_successes)
    {
        qcc_logger_printf(&eng->logger, "%s:\n", name);
        qcc_logger_printf(
            &eng->logger,
            "    Warning: Only %u successful runs out of %u were made\n",
            successes, eng->required_successes);
    }
}